

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
SimpleSerialAnalyzerSettings::LoadSettings(SimpleSerialAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  SimpleArchive local_20 [8];
  
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mInputChannelInterface);
  AnalyzerSettingInterfaceInteger::SetInteger((int)this + 0x40);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SimpleSerialAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	text_archive >> mInputChannel;
	text_archive >> mBitRate;

	ClearChannels();
	AddChannel( mInputChannel, "Simple Serial", true );

	UpdateInterfacesFromSettings();
}